

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnFunction(BinaryReaderIR *this,Index index,Index sig_index)

{
  Func *pFVar1;
  pointer *__ptr;
  _Head_base<0UL,_wabt::FuncModuleField_*,_false> local_a8;
  FuncModuleField *local_a0;
  Location local_98;
  Var local_78;
  
  GetLocation(&local_98,this);
  MakeUnique<wabt::FuncModuleField,wabt::Location>((wabt *)&local_a0,&local_98);
  pFVar1 = &local_a0->func;
  GetLocation(&local_98,this);
  Var::Var(&local_78,sig_index,&local_98);
  SetFuncDeclaration(this,&pFVar1->decl,&local_78);
  Var::~Var(&local_78);
  local_a8._M_head_impl = local_a0;
  local_a0 = (FuncModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                       *)&local_a8);
  if (local_a8._M_head_impl != (FuncModuleField *)0x0) {
    (*((local_a8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_a8._M_head_impl = (FuncModuleField *)0x0;
  if (local_a0 != (FuncModuleField *)0x0) {
    (**(code **)(*(long *)local_a0 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFunction(Index index, Index sig_index) {
  auto field = MakeUnique<FuncModuleField>(GetLocation());
  Func& func = field->func;
  SetFuncDeclaration(&func.decl, Var(sig_index, GetLocation()));
  module_->AppendField(std::move(field));
  return Result::Ok;
}